

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Publications.cpp
# Opt level: O0

void __thiscall
helics::Publication::Publication
          (Publication *this,InterfaceVisibility locality,ValueFederate *valueFed,string_view key,
          string_view type,string_view units)

{
  string_view type_00;
  string_view units_00;
  string_view name;
  string_view units_01;
  int in_ESI;
  undefined8 *in_RDI;
  ValueFederate *in_R8;
  Publication *in_stack_00000018;
  Publication *in_stack_00000020;
  RegistrationFailure *anon_var_0;
  Interface *in_stack_fffffffffffffef0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  ValueFederate *this_00;
  char *pcVar1;
  string_view in_stack_ffffffffffffff48;
  size_t in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff68;
  string_view in_stack_ffffffffffffff98;
  size_t in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  size_t in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  Interface::Interface(in_stack_fffffffffffffef0);
  *in_RDI = &PTR__Publication_009bd978;
  in_RDI[7] = 0;
  *(undefined4 *)(in_RDI + 8) = 0xffffffff;
  in_RDI[9] = 0;
  in_RDI[10] = 0xbff0000000000000;
  *(undefined4 *)(in_RDI + 0xb) = 0x62ae;
  *(undefined1 *)((long)in_RDI + 0x5c) = 0;
  *(undefined1 *)((long)in_RDI + 0x5d) = 0;
  in_RDI[0xc] = 0;
  CLI::std::
  variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
  ::variant((variant<double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
             *)0x3ac056);
  this_00 = (ValueFederate *)(in_RDI + 0x13);
  std::__cxx11::string::string(in_stack_ffffffffffffff00);
  pcVar1 = (char *)(in_RDI + 0x17);
  std::shared_ptr<units::precise_unit>::shared_ptr((shared_ptr<units::precise_unit> *)0x3ac082);
  if (in_ESI == 1) {
    type_00._M_str = pcVar1;
    type_00._M_len = (size_t)in_RDI;
    units_00._M_str = in_stack_ffffffffffffff68;
    units_00._M_len = in_stack_ffffffffffffff60;
    helics::ValueFederate::registerGlobalPublication
              (this_00,in_stack_ffffffffffffff48,type_00,units_00);
    operator=(in_stack_00000020,in_stack_00000018);
  }
  else {
    name._M_str = in_stack_ffffffffffffffb0;
    name._M_len = in_stack_ffffffffffffffa8;
    units_01._M_str = in_stack_ffffffffffffffc8;
    units_01._M_len = in_stack_ffffffffffffffc0;
    helics::ValueFederate::registerPublication(in_R8,name,in_stack_ffffffffffffff98,units_01);
    operator=(in_stack_00000020,in_stack_00000018);
  }
  return;
}

Assistant:

Publication::Publication(InterfaceVisibility locality,
                         ValueFederate* valueFed,
                         std::string_view key,
                         std::string_view type,
                         std::string_view units)
{
    try {
        if (locality == InterfaceVisibility::GLOBAL) {
            operator=(valueFed->registerGlobalPublication(key, type, units));
        } else {
            operator=(valueFed->registerPublication(key, type, units));
        }
    }
    catch (const RegistrationFailure&) {
        operator=(valueFed->getPublication(key));
        if (!isValid()) {
            throw;
        }
    }
}